

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O1

Type __thiscall QtPromise::resolve<QByteArray>(QtPromise *this,QByteArray *value)

{
  QSharedData *pQVar1;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data> QVar2;
  undefined8 *puVar3;
  PromiseData<QByteArray> *extraout_RDX;
  PromiseData<QByteArray> *extraout_RDX_00;
  PromiseData<QByteArray> *extraout_RDX_01;
  PromiseData<QByteArray> *extraout_RDX_02;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QByteArray>_> QVar4;
  Type TVar5;
  PromiseResolver<QByteArray> resolver;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data> local_48;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QByteArray>::Data> local_40;
  QPromise<QByteArray> local_38;
  
  *(undefined ***)this = &PTR__QPromiseBase_00155938;
  puVar3 = (undefined8 *)operator_new(0x68);
  *puVar3 = 0;
  puVar3[1] = 0;
  puVar3[2] = 0;
  puVar3[3] = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  *puVar3 = &PTR__PromiseDataBase_001559c0;
  QReadWriteLock::QReadWriteLock((QReadWriteLock *)(puVar3 + 2),0);
  *(undefined1 *)(puVar3 + 3) = 0;
  puVar3[4] = 0;
  puVar3[5] = 0;
  puVar3[6] = 0;
  puVar3[7] = 0;
  puVar3[8] = 0;
  puVar3[9] = 0;
  puVar3[10] = 0;
  *puVar3 = &PTR__PromiseData_00155958;
  puVar3[0xb] = 0;
  puVar3[0xc] = 0;
  *(undefined8 **)(this + 8) = puVar3;
  LOCK();
  *(int *)(puVar3 + 1) = *(int *)(puVar3 + 1) + 1;
  UNLOCK();
  local_38.super_QPromiseBase<QByteArray>.m_d.d = *(PromiseData<QByteArray> **)(this + 8);
  if (local_38.super_QPromiseBase<QByteArray>.m_d.d != (PromiseData<QByteArray> *)0x0) {
    LOCK();
    pQVar1 = &((local_38.super_QPromiseBase<QByteArray>.m_d.d)->
              super_PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38.super_QPromiseBase<QByteArray>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_001558f0;
  QtPromisePrivate::PromiseResolver<QByteArray>::PromiseResolver
            ((PromiseResolver<QByteArray> *)&local_40,&local_38);
  local_38.super_QPromiseBase<QByteArray>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00155938;
  if (local_38.super_QPromiseBase<QByteArray>.m_d.d != (PromiseData<QByteArray> *)0x0) {
    LOCK();
    pQVar1 = &((local_38.super_QPromiseBase<QByteArray>.m_d.d)->
              super_PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_38.super_QPromiseBase<QByteArray>.m_d.d != (PromiseData<QByteArray> *)0x0)) {
      (*((local_38.super_QPromiseBase<QByteArray>.m_d.d)->
        super_PromiseDataBase<QByteArray,_void_(const_QByteArray_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  QVar2.d = local_40.d;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_48.d = local_40.d;
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QtPromisePrivate::PromiseResolver<QByteArray>::resolve<QByteArray>
            ((PromiseResolver<QByteArray> *)&local_48,value);
  QVar4.d = extraout_RDX;
  if (QVar2.d != (Data *)0x0) {
    LOCK();
    ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((QVar2.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(QVar2.d,0x10);
      QVar4.d = extraout_RDX_00;
    }
  }
  if (local_48.d != (Data *)0x0) {
    LOCK();
    ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_48.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_48.d != (Data *)0x0)) {
      operator_delete(local_48.d,0x10);
      QVar4.d = extraout_RDX_01;
    }
  }
  if (local_40.d != (Data *)0x0) {
    LOCK();
    ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((local_40.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) &&
       (local_40.d != (Data *)0x0)) {
      operator_delete(local_40.d,0x10);
      QVar4.d = extraout_RDX_02;
    }
  }
  *(undefined ***)this = &PTR__QPromiseBase_001558f0;
  TVar5.super_QPromiseBase<QByteArray>.m_d.d = QVar4.d;
  TVar5.super_QPromiseBase<QByteArray>._vptr_QPromiseBase = (_func_int **)this;
  return (Type)TVar5.super_QPromiseBase<QByteArray>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}